

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e1.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  istream *piVar2;
  ostream *poVar3;
  int m;
  int local_20;
  int d;
  
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_20);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&m);
  std::istream::operator>>(piVar2,&d);
  m = m + d;
  if (0x3b < m) {
    uVar1 = (uint)m / 0x3c;
    m = (uint)m % 0x3c;
    local_20 = local_20 + uVar1;
  }
  local_20 = local_20 % 0x18;
  *(undefined8 *)(std::operator<< + *(long *)(std::cout + -0x18)) = 2;
  poVar3 = std::operator<<(&std::cout,0x30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
  poVar3 = std::operator<<(poVar3," ");
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  poVar3 = std::operator<<(poVar3,0x30);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,m);
  std::operator<<(poVar3,"\n");
  return 0;
}

Assistant:

int main() {
    int h, m, d;
    cin >> h >> m >> d;
    m += d;
    if (m >= 60) {
        h += (m / 60);
        m %= 60;
    }
    h %= 24;
    cout << setw(2) << setfill('0') << h << " " << setw(2) << setfill('0') << m
         << "\n";
}